

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O2

Socket * sshproxy_new_connection
                   (SockAddr *addr,char *hostname,int port,_Bool privport,_Bool oobinline,
                   _Bool nodelay,_Bool keepalive,Plug *plug,Conf *clientconf,Interactor *clientitr)

{
  _Bool _Var1;
  int iVar2;
  undefined8 *__s;
  Conf *pCVar3;
  char *pcVar4;
  BackendVtable *pBVar5;
  LogContext *pLVar6;
  LogPolicy *pLVar7;
  Seat *pSVar8;
  char *pcVar9;
  char *realhost;
  
  __s = (undefined8 *)safemalloc(1,0x20b8,0);
  memset(__s,0,0x20a0);
  __s[0x414] = &SshProxy_sock_vt;
  __s[0x415] = &SshProxy_logpolicy_vt;
  __s[0x416] = &SshProxy_seat_vt;
  __s[0x40a] = plug;
  psb_init((ProxyStderrBuf *)(__s + 9));
  bufchain_init((bufchain *)(__s + 0x40c));
  __s[0x412] = addr;
  *(int *)(__s + 0x413) = port;
  pCVar3 = conf_new();
  __s[1] = pCVar3;
  pcVar4 = conf_get_str(clientconf,0xe);
  _Var1 = do_defaults(pcVar4,(Conf *)__s[1]);
  if (_Var1) {
    _Var1 = conf_launchable((Conf *)__s[1]);
    if (_Var1) goto LAB_0013bfd6;
    pcVar9 = "saved session \'%s\' is not launchable";
  }
  else {
    do_defaults((char *)0x0,(Conf *)__s[1]);
    conf_set_int((Conf *)__s[1],2,3);
    conf_set_str((Conf *)__s[1],0,pcVar4);
    pCVar3 = (Conf *)__s[1];
    iVar2 = conf_get_int(clientconf,0xf);
    conf_set_int(pCVar3,1,iVar2);
LAB_0013bfd6:
    pcVar9 = conf_get_str(clientconf,0x10);
    if (*pcVar9 != '\0') {
      conf_set_str((Conf *)__s[1],0x39,pcVar9);
    }
    pcVar9 = conf_get_str(clientconf,0x11);
    if (*pcVar9 != '\0') {
      pcVar9 = dupstr(pcVar9);
      __s[8] = pcVar9;
      *(undefined1 *)(__s + 7) = 1;
    }
    iVar2 = conf_get_int((Conf *)__s[1],2);
    pBVar5 = backend_vt_from_proto(iVar2);
    if ((pBVar5 == (BackendVtable *)0x0) || ((pBVar5->flags & 4) == 0)) {
      pcVar9 = "saved session \'%s\' is not an SSH session";
    }
    else {
      if ((pBVar5->flags & 8) == 0) {
        __assert_fail("backvt->flags & BACKEND_NOTIFIES_SESSION_START && \"Backend provides NC_HOST without SESSION_START!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/sshproxy.c"
                      ,0x27e,
                      "Socket *sshproxy_new_connection(SockAddr *, const char *, int, _Bool, _Bool, _Bool, _Bool, Plug *, Conf *, Interactor *)"
                     );
      }
      conf_set_bool((Conf *)__s[1],0xc1,false);
      conf_set_bool((Conf *)__s[1],0xaa,false);
      conf_set_bool((Conf *)__s[1],0x1e,false);
      while( true ) {
        pcVar4 = conf_get_str_nthstrkey((Conf *)__s[1],0xb0,0);
        if (pcVar4 == (char *)0x0) break;
        conf_del_str_str((Conf *)__s[1],0xb0,pcVar4);
      }
      conf_set_bool((Conf *)__s[1],0xbf,true);
      iVar2 = conf_get_int(clientconf,0xd);
      if (iVar2 - 7U < 2) {
        pCVar3 = conf_copy(clientconf);
        conf_set_str(pCVar3,0x10,"");
        conf_set_str(pCVar3,0x11,"");
        pcVar4 = format_telnet_command
                           ((SockAddr *)__s[0x412],*(int *)(__s + 0x413),pCVar3,(uint *)0x0);
        conf_free(pCVar3);
        conf_set_str((Conf *)__s[1],0x14,pcVar4);
        safefree(pcVar4);
        conf_set_bool((Conf *)__s[1],0x16,true);
        if (iVar2 == 8) {
          conf_set_bool((Conf *)__s[1],0x30,true);
        }
      }
      else {
        if (iVar2 != 6) {
          __assert_fail("false && \"bad SSH proxy type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/sshproxy.c"
                        ,0x2bd,
                        "Socket *sshproxy_new_connection(SockAddr *, const char *, int, _Bool, _Bool, _Bool, _Bool, Plug *, Conf *, Interactor *)"
                       );
        }
        conf_set_str((Conf *)__s[1],0x33,hostname);
        conf_set_int((Conf *)__s[1],0x34,port);
      }
      prepare_session((Conf *)__s[1]);
      pLVar6 = log_init((LogPolicy *)(__s + 0x415),(Conf *)__s[1]);
      __s[2] = pLVar6;
      pCVar3 = (Conf *)__s[1];
      pcVar4 = conf_get_str(pCVar3,0);
      iVar2 = conf_get_int((Conf *)__s[1],1);
      _Var1 = conf_get_bool((Conf *)__s[1],8);
      pcVar4 = (*pBVar5->init)(pBVar5,(Seat *)(__s + 0x416),(Backend **)(__s + 3),pLVar6,pCVar3,
                               pcVar4,iVar2,&realhost,nodelay,_Var1);
      if (pcVar4 == (char *)0x0) {
        safefree(realhost);
        if (clientitr != (Interactor *)0x0) {
          __s[6] = clientitr;
          *(Interactor **)(*(long *)(__s[3] + 8) + 8) = clientitr;
          pLVar7 = (*clientitr->vt->logpolicy)(clientitr);
          __s[4] = pLVar7;
          if ((pBVar5->flags & 8) != 0) {
            pSVar8 = interactor_borrow_seat(clientitr);
            __s[5] = pSVar8;
          }
        }
        goto LAB_0013c04e;
      }
      pcVar9 = "unable to open SSH proxy connection: %s";
    }
  }
  pcVar4 = dupprintf(pcVar9,pcVar4);
  *__s = pcVar4;
LAB_0013c04e:
  return (Socket *)(__s + 0x414);
}

Assistant:

Socket *sshproxy_new_connection(SockAddr *addr, const char *hostname,
                                int port, bool privport,
                                bool oobinline, bool nodelay, bool keepalive,
                                Plug *plug, Conf *clientconf,
                                Interactor *clientitr)
{
    SshProxy *sp = snew(SshProxy);
    memset(sp, 0, sizeof(*sp));

    sp->sock.vt = &SshProxy_sock_vt;
    sp->logpolicy.vt = &SshProxy_logpolicy_vt;
    sp->seat.vt = &SshProxy_seat_vt;
    sp->plug = plug;
    psb_init(&sp->psb);
    bufchain_init(&sp->ssh_to_socket);

    sp->addr = addr;
    sp->port = port;

    sp->conf = conf_new();
    /* Try to treat proxy_hostname as the title of a saved session. If
     * that fails, set up a default Conf of our own treating it as a
     * hostname. */
    const char *proxy_hostname = conf_get_str(clientconf, CONF_proxy_host);
    if (do_defaults(proxy_hostname, sp->conf)) {
        if (!conf_launchable(sp->conf)) {
            sp->errmsg = dupprintf("saved session '%s' is not launchable",
                                   proxy_hostname);
            return &sp->sock;
        }
    } else {
        do_defaults(NULL, sp->conf);
        /* In hostname mode, we default to PROT_SSH. This is more useful than
         * the obvious approach of defaulting to the protocol defined in
         * Default Settings, because only SSH (ok, and bare ssh-connection)
         * can be used for this kind of proxy. */
        conf_set_int(sp->conf, CONF_protocol, PROT_SSH);
        conf_set_str(sp->conf, CONF_host, proxy_hostname);
        conf_set_int(sp->conf, CONF_port,
                     conf_get_int(clientconf, CONF_proxy_port));
    }
    const char *proxy_username = conf_get_str(clientconf, CONF_proxy_username);
    if (*proxy_username)
        conf_set_str(sp->conf, CONF_username, proxy_username);

    const char *proxy_password = conf_get_str(clientconf, CONF_proxy_password);
    if (*proxy_password) {
        sp->proxy_password = dupstr(proxy_password);
        sp->got_proxy_password = true;
    }

    const struct BackendVtable *backvt = backend_vt_from_proto(
        conf_get_int(sp->conf, CONF_protocol));

    /*
     * We don't actually need an _SSH_ session specifically: it's also
     * OK to use PROT_SSHCONN, because really, the criterion is
     * whether setting CONF_ssh_nc_host will do anything useful. So
     * our check is for whether the backend sets the flag promising
     * that it does.
     */
    if (!backvt || !(backvt->flags & BACKEND_SUPPORTS_NC_HOST)) {
        sp->errmsg = dupprintf("saved session '%s' is not an SSH session",
                               proxy_hostname);
        return &sp->sock;
    }

    /*
     * We also expect that the backend will announce a willingness to
     * notify us that the session has started. Any backend providing
     * NC_HOST should also provide this.
     */
    assert(backvt->flags & BACKEND_NOTIFIES_SESSION_START &&
           "Backend provides NC_HOST without SESSION_START!");

    /*
     * Turn off SSH features we definitely don't want. It would be
     * awkward and counterintuitive to have the proxy SSH connection
     * become a connection-sharing upstream (but it's fine to have it
     * be a downstream, if that's configured). And we don't want to
     * open X forwardings, agent forwardings or (other) port
     * forwardings as a side effect of this one operation.
     */
    conf_set_bool(sp->conf, CONF_ssh_connection_sharing_upstream, false);
    conf_set_bool(sp->conf, CONF_x11_forward, false);
    conf_set_bool(sp->conf, CONF_agentfwd, false);
    for (const char *subkey;
         (subkey = conf_get_str_nthstrkey(sp->conf, CONF_portfwd, 0)) != NULL;)
        conf_del_str_str(sp->conf, CONF_portfwd, subkey);

    /*
     * We'll only be running one channel through this connection
     * (since we've just turned off all the other things we might have
     * done with it), so we can configure it as simple.
     */
    conf_set_bool(sp->conf, CONF_ssh_simple, true);

    int proxy_type = conf_get_int(clientconf, CONF_proxy_type);
    switch (proxy_type) {
      case PROXY_SSH_TCPIP:
        /*
         * Configure the main channel of this SSH session to be a
         * direct-tcpip connection to the destination host/port.
         */
        conf_set_str(sp->conf, CONF_ssh_nc_host, hostname);
        conf_set_int(sp->conf, CONF_ssh_nc_port, port);
        break;

      case PROXY_SSH_SUBSYSTEM:
      case PROXY_SSH_EXEC: {
        Conf *cmd_conf = conf_copy(clientconf);

        /*
         * Unlike the Telnet and Local proxy types, we don't use the
         * proxy username and password fields in the formatted
         * command, because if we use them at all, it's for
         * authenticating to the proxy SSH server.
         */
        conf_set_str(cmd_conf, CONF_proxy_username, "");
        conf_set_str(cmd_conf, CONF_proxy_password, "");

        char *cmd = format_telnet_command(sp->addr, sp->port, cmd_conf, NULL);
        conf_free(cmd_conf);

        conf_set_str(sp->conf, CONF_remote_cmd, cmd);
        sfree(cmd);

        conf_set_bool(sp->conf, CONF_nopty, true);

        if (proxy_type == PROXY_SSH_SUBSYSTEM)
            conf_set_bool(sp->conf, CONF_ssh_subsys, true);

        break;
      }

      default:
        unreachable("bad SSH proxy type");
    }

    /*
     * Do the usual normalisation of things in the Conf like a "user@"
     * prefix on the hostname field.
     */
    prepare_session(sp->conf);

    sp->logctx = log_init(&sp->logpolicy, sp->conf);

    char *error, *realhost;
    error = backend_init(backvt, &sp->seat, &sp->backend, sp->logctx, sp->conf,
                         conf_get_str(sp->conf, CONF_host),
                         conf_get_int(sp->conf, CONF_port),
                         &realhost, nodelay,
                         conf_get_bool(sp->conf, CONF_tcp_keepalives));
    if (error) {
        sp->errmsg = dupprintf("unable to open SSH proxy connection: %s",
                               error);
        return &sp->sock;
    }

    sfree(realhost);

    /*
     * If we've been given an Interactor by the caller, set ourselves
     * up to work with it.
     */
    if (clientitr) {
        sp->clientitr = clientitr;
        interactor_set_child(sp->clientitr, sp->backend->interactor);

        sp->clientlp = interactor_logpolicy(clientitr);

        /*
         * We can only borrow the client's Seat if our own backend
         * will tell us when to give it back. (SSH-based backends
         * _should_ do that, but we check the flag here anyway.)
         */
        if (backvt->flags & BACKEND_NOTIFIES_SESSION_START)
            sp->clientseat = interactor_borrow_seat(clientitr);
    }

    return &sp->sock;
}